

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.c
# Opt level: O3

wchar_t mb_to_wc(wchar_t codepage,wchar_t flags,char *mbstr,wchar_t mblen,wchar_t *wcstr,
                wchar_t wclen)

{
  wchar_t wVar1;
  ulong uVar2;
  size_t sVar3;
  uint uVar4;
  ulong uVar5;
  wchar_t local_44;
  mbstate_t state;
  char *local_38;
  
  local_44 = mblen;
  local_38 = mbstr;
  if (codepage == L'\xffff') {
    state.__count = L'\0';
    state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
    uVar5 = 0;
    if (L'\0' < wclen && L'\0' < mblen) {
      uVar5 = 0;
      do {
        sVar3 = mbrtowc(wcstr,mbstr,(ulong)(uint)mblen,(mbstate_t *)&state);
        if (0xfffffffffffffffd < sVar3) break;
        uVar5 = uVar5 + 1;
        mblen = mblen - (int)sVar3;
        if (mblen < L'\x01') break;
        mbstr = mbstr + sVar3;
        wcstr = wcstr + 1;
      } while (uVar5 < (uint)wclen);
    }
  }
  else if (codepage == L'\0') {
    uVar5 = 0;
    if (L'\0' < wclen && L'\0' < mblen) {
      uVar4 = wclen + L'\xffffffff';
      if ((uint)(mblen + L'\xffffffff') < (uint)(wclen + L'\xffffffff')) {
        uVar4 = mblen + L'\xffffffff';
      }
      uVar5 = (ulong)(uVar4 + 1);
      uVar2 = 0;
      do {
        wcstr[uVar2] = (byte)mbstr[uVar2] | 0xd800;
        uVar2 = uVar2 + 1;
      } while (uVar5 != uVar2);
    }
  }
  else {
    wVar1 = charset_to_unicode(&local_38,&local_44,wcstr,wclen,codepage,(charset_state *)0x0,
                               (wchar_t *)0x0,L'\0');
    uVar5 = (ulong)(uint)wVar1;
  }
  return (wchar_t)uVar5;
}

Assistant:

int mb_to_wc(int codepage, int flags, const char *mbstr, int mblen,
             wchar_t *wcstr, int wclen)
{
    if (codepage == DEFAULT_CODEPAGE) {
        int n = 0;
        mbstate_t state;

        memset(&state, 0, sizeof state);

        while (mblen > 0) {
            if (n >= wclen)
                return n;
            size_t i = mbrtowc(wcstr+n, mbstr, (size_t)mblen, &state);
            if (i == (size_t)-1 || i == (size_t)-2)
                break;
            n++;
            mbstr += i;
            mblen -= i;
        }

        return n;
    } else if (codepage == CS_NONE) {
        int n = 0;

        while (mblen > 0) {
            if (n >= wclen)
                return n;
            wcstr[n] = 0xD800 | (mbstr[0] & 0xFF);
            n++;
            mbstr++;
            mblen--;
        }

        return n;
    } else
        return charset_to_unicode(&mbstr, &mblen, wcstr, wclen, codepage,
                                  NULL, NULL, 0);
}